

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O1

ktx_error_code_e
ktxTexture1_GLUpload(ktxTexture1 *This,GLuint *pTexture,GLenum *pTarget,GLenum *pGlerror)

{
  ktx_error_code_e kVar1;
  GLint previousUnpackAlignment;
  int local_4c;
  ktx_glformatinfo local_48;
  
  kVar1 = KTX_INVALID_VALUE;
  if (pTarget != (GLenum *)0x0 && This != (ktxTexture1 *)0x0) {
    kVar1 = ktxLoadOpenGL((PFNGLGETPROCADDRESS)0x0);
    if (kVar1 == KTX_SUCCESS) {
      (*gl.glGetIntegerv)(0xcf5,&local_4c);
      if (local_4c != 4) {
        (*gl.glPixelStorei)(0xcf5,4);
      }
      local_48.glFormat = This->glFormat;
      local_48.glInternalformat = This->glInternalformat;
      local_48.glBaseInternalformat = This->glBaseInternalformat;
      local_48.glType = This->glType;
      kVar1 = ktxTexture_GLUploadPrivate((ktxTexture *)This,&local_48,pTexture,pTarget,pGlerror);
      if (local_4c != 4) {
        (*gl.glPixelStorei)(0xcf5,local_4c);
      }
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture1_GLUpload(ktxTexture1* This, GLuint* pTexture, GLenum* pTarget,
                     GLenum* pGlerror)
{
    GLint                 previousUnpackAlignment;
    KTX_error_code        result = KTX_SUCCESS;
    ktx_glformatinfo      formatInfo;

    if (!This) {
        return KTX_INVALID_VALUE;
    }

    if (!pTarget) {
        return KTX_INVALID_VALUE;
    }

    result = ktxLoadOpenGL(NULL);
    if (result != KTX_SUCCESS) {
        return result;
    }
    /* KTX 1 files require an unpack alignment of 4 */
    glGetIntegerv(GL_UNPACK_ALIGNMENT, &previousUnpackAlignment);
    if (previousUnpackAlignment != KTX_GL_UNPACK_ALIGNMENT) {
        glPixelStorei(GL_UNPACK_ALIGNMENT, KTX_GL_UNPACK_ALIGNMENT);
    }

    formatInfo.glFormat = This->glFormat;
    formatInfo.glInternalformat = This->glInternalformat;
    formatInfo.glBaseInternalformat = This->glBaseInternalformat;
    formatInfo.glType = This->glType;
 
    result = ktxTexture_GLUploadPrivate(ktxTexture(This), &formatInfo,
                                        pTexture, pTarget, pGlerror);

    /* restore previous GL state */
    if (previousUnpackAlignment != KTX_GL_UNPACK_ALIGNMENT) {
        glPixelStorei(GL_UNPACK_ALIGNMENT, previousUnpackAlignment);
    }

    return result;
}